

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_Thing_CanRaise(AActor *thing)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  FState *pFVar6;
  AActor *pAVar7;
  DVector2 local_28;
  
  pFVar6 = AActor::GetRaiseState(thing);
  if (pFVar6 == (FState *)0x0) {
    bVar5 = false;
  }
  else {
    pAVar7 = AActor::GetDefault(thing);
    uVar1 = (thing->flags).Value;
    (thing->flags).Value = uVar1 | 2;
    local_28.X = (thing->__Pos).X;
    local_28.Y = (thing->__Pos).Y;
    dVar2 = thing->radius;
    dVar3 = thing->Height;
    dVar4 = pAVar7->Height;
    thing->radius = pAVar7->radius;
    thing->Height = dVar4;
    bVar5 = P_CheckPosition(thing,&local_28,false);
    (thing->flags).Value = uVar1;
    thing->radius = dVar2;
    thing->Height = dVar3;
  }
  return bVar5;
}

Assistant:

bool P_Thing_CanRaise(AActor *thing)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return false;
	}
	
	AActor *info = thing->GetDefault();

	// Check against real height and radius
	ActorFlags oldflags = thing->flags;
	double oldheight = thing->Height;
	double oldradius = thing->radius;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;
	thing->radius = info->radius;

	bool check = P_CheckPosition (thing, thing->Pos());

	// Restore checked properties
	thing->flags = oldflags;
	thing->radius = oldradius;
	thing->Height = oldheight;

	if (!check)
	{
		return false;
	}

	return true;
}